

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

void __thiscall cmServerBase::cmServerBase(cmServerBase *this,cmConnection *connection)

{
  int iVar1;
  int err;
  cmConnection *connection_local;
  cmServerBase *this_local;
  
  this->_vptr_cmServerBase = (_func_int **)&PTR__cmServerBase_00be59c8;
  std::
  vector<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
  ::vector(&this->Connections);
  std::atomic<bool>::atomic(&this->ServeThreadRunning,false);
  auto_async_t::auto_async_t(&this->ShutdownSignal);
  this->ServeThreadId = 0;
  auto_signal_t::auto_signal_t(&this->SIGINTHandler);
  auto_signal_t::auto_signal_t(&this->SIGHUPHandler);
  iVar1 = uv_loop_init(&this->Loop);
  (this->Loop).data = this;
  if (iVar1 != 0) {
    __assert_fail("err == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServer.cxx"
                  ,0x1ff,"cmServerBase::cmServerBase(cmConnection *)");
  }
  iVar1 = uv_rwlock_init(&this->ConnectionsMutex);
  if (iVar1 == 0) {
    (*this->_vptr_cmServerBase[2])(this,connection);
    return;
  }
  __assert_fail("err == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServer.cxx"
                ,0x202,"cmServerBase::cmServerBase(cmConnection *)");
}

Assistant:

cmServerBase::cmServerBase(cmConnection* connection)
{
  auto err = uv_loop_init(&Loop);
  Loop.data = this;
  assert(err == 0);

  err = uv_rwlock_init(&ConnectionsMutex);
  assert(err == 0);

  AddNewConnection(connection);
}